

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_getStarters_63(UConverter *converter,UBool *starters,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  UBool *starters_local;
  UConverter *converter_local;
  
  if ((err != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*err), UVar1 == '\0')) {
    if (converter->sharedData->impl->getStarters == (UConverterGetStarters)0x0) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      (*converter->sharedData->impl->getStarters)(converter,starters,err);
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_getStarters(const UConverter* converter, 
                 UBool starters[256],
                 UErrorCode* err)
{
    if (err == NULL || U_FAILURE(*err)) {
        return;
    }

    if(converter->sharedData->impl->getStarters != NULL) {
        converter->sharedData->impl->getStarters(converter, starters, err);
    } else {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
}